

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_loop_restoration_alloc
               (AV1LrSync *lr_sync,AV1_COMMON *cm,int num_workers,int num_rows_lr,int num_planes,
               int width)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int j_1;
  int worker_idx;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  int in_stack_ffffffffffffffdc;
  
  *(int *)(in_RDI + 0x4c) = in_ECX;
  *(int *)(in_RDI + 0x50) = in_R8D;
  for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
    pvVar1 = aom_malloc(0x6e043e);
    *(void **)(in_RDI + (long)iVar2 * 8) = pvVar1;
    if (*(long *)(in_RDI + (long)iVar2 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate lr_sync->mutex_[j]");
    }
    if (*(long *)(in_RDI + (long)iVar2 * 8) != 0) {
      for (in_stack_ffffffffffffffdc = 0; in_stack_ffffffffffffffdc < in_ECX;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        pthread_mutex_init((pthread_mutex_t *)
                           (*(long *)(in_RDI + (long)iVar2 * 8) +
                           (long)in_stack_ffffffffffffffdc * 0x28),(pthread_mutexattr_t *)0x0);
      }
    }
    pvVar1 = aom_malloc(0x6e04e3);
    *(void **)(in_RDI + 0x18 + (long)iVar2 * 8) = pvVar1;
    if (*(long *)(in_RDI + 0x18 + (long)iVar2 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate lr_sync->cond_[j]");
    }
    if (*(long *)(in_RDI + 0x18 + (long)iVar2 * 8) != 0) {
      for (in_stack_ffffffffffffffdc = 0; in_stack_ffffffffffffffdc < in_ECX;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        pthread_cond_init((pthread_cond_t *)
                          (*(long *)(in_RDI + 0x18 + (long)iVar2 * 8) +
                          (long)in_stack_ffffffffffffffdc * 0x30),(pthread_condattr_t *)0x0);
      }
    }
  }
  pvVar1 = aom_malloc(0x6e059a);
  *(void **)(in_RDI + 0x58) = pvVar1;
  if (*(long *)(in_RDI + 0x58) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate lr_sync->job_mutex");
  }
  if (*(long *)(in_RDI + 0x58) != 0) {
    pthread_mutex_init(*(pthread_mutex_t **)(in_RDI + 0x58),(pthread_mutexattr_t *)0x0);
  }
  pvVar1 = aom_calloc(CONCAT44(in_stack_ffffffffffffffdc,iVar2),
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(void **)(in_RDI + 0x60) = pvVar1;
  if (*(long *)(in_RDI + 0x60) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate lr_sync->lrworkerdata");
  }
  *(int *)(in_RDI + 0x54) = in_EDX;
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    if (iVar2 < in_EDX + -1) {
      pvVar1 = aom_memalign(CONCAT44(in_EDX,in_ECX),CONCAT44(in_R8D,in_R9D));
      *(void **)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 0x1c0) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 0x1c0) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate lr_sync->lrworkerdata[worker_idx].rst_tmpbuf");
      }
      pvVar1 = aom_malloc(0x6e06e1);
      *(void **)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 0x1c0 + 8) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 0x1c0 + 8) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate lr_sync->lrworkerdata[worker_idx].rlbs");
      }
    }
    else {
      *(undefined8 *)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 0x1c0) =
           *(undefined8 *)(in_RSI + 0x5ae0);
      *(undefined8 *)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 0x1c0 + 8) =
           *(undefined8 *)(in_RSI + 0x5ae8);
    }
  }
  for (iVar2 = 0; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
    pvVar1 = aom_malloc(0x6e07c2);
    *(void **)(in_RDI + 0x30 + (long)iVar2 * 8) = pvVar1;
    if (*(long *)(in_RDI + 0x30 + (long)iVar2 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate lr_sync->cur_sb_col[j]");
    }
  }
  pvVar1 = aom_malloc(0x6e082c);
  *(void **)(in_RDI + 0x68) = pvVar1;
  if (*(long *)(in_RDI + 0x68) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate lr_sync->job_queue");
  }
  iVar2 = get_lr_sync_range(in_R9D);
  *(int *)(in_RDI + 0x48) = iVar2;
  return;
}

Assistant:

void av1_loop_restoration_alloc(AV1LrSync *lr_sync, AV1_COMMON *cm,
                                int num_workers, int num_rows_lr,
                                int num_planes, int width) {
  lr_sync->rows = num_rows_lr;
  lr_sync->num_planes = num_planes;
#if CONFIG_MULTITHREAD
  {
    int i, j;

    for (j = 0; j < num_planes; j++) {
      CHECK_MEM_ERROR(cm, lr_sync->mutex_[j],
                      aom_malloc(sizeof(*(lr_sync->mutex_[j])) * num_rows_lr));
      if (lr_sync->mutex_[j]) {
        for (i = 0; i < num_rows_lr; ++i) {
          pthread_mutex_init(&lr_sync->mutex_[j][i], NULL);
        }
      }

      CHECK_MEM_ERROR(cm, lr_sync->cond_[j],
                      aom_malloc(sizeof(*(lr_sync->cond_[j])) * num_rows_lr));
      if (lr_sync->cond_[j]) {
        for (i = 0; i < num_rows_lr; ++i) {
          pthread_cond_init(&lr_sync->cond_[j][i], NULL);
        }
      }
    }

    CHECK_MEM_ERROR(cm, lr_sync->job_mutex,
                    aom_malloc(sizeof(*(lr_sync->job_mutex))));
    if (lr_sync->job_mutex) {
      pthread_mutex_init(lr_sync->job_mutex, NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD
  CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata,
                  aom_calloc(num_workers, sizeof(*(lr_sync->lrworkerdata))));
  lr_sync->num_workers = num_workers;

  for (int worker_idx = 0; worker_idx < num_workers; ++worker_idx) {
    if (worker_idx < num_workers - 1) {
      CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata[worker_idx].rst_tmpbuf,
                      (int32_t *)aom_memalign(16, RESTORATION_TMPBUF_SIZE));
      CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata[worker_idx].rlbs,
                      aom_malloc(sizeof(RestorationLineBuffers)));

    } else {
      lr_sync->lrworkerdata[worker_idx].rst_tmpbuf = cm->rst_tmpbuf;
      lr_sync->lrworkerdata[worker_idx].rlbs = cm->rlbs;
    }
  }

  for (int j = 0; j < num_planes; j++) {
    CHECK_MEM_ERROR(
        cm, lr_sync->cur_sb_col[j],
        aom_malloc(sizeof(*(lr_sync->cur_sb_col[j])) * num_rows_lr));
  }
  CHECK_MEM_ERROR(
      cm, lr_sync->job_queue,
      aom_malloc(sizeof(*(lr_sync->job_queue)) * num_rows_lr * num_planes));
  // Set up nsync.
  lr_sync->sync_range = get_lr_sync_range(width);
}